

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFontGlyphRangesBuilder::AddText(ImFontGlyphRangesBuilder *this,char *text,char *text_end)

{
  uint *puVar1;
  int iVar2;
  ulong in_RAX;
  uint uVar3;
  uint c;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  while( true ) {
    if (text_end == (char *)0x0) {
      uVar3 = (uint)*text;
    }
    else {
      uVar3 = (uint)(text < text_end);
    }
    if (uVar3 == 0) {
      return;
    }
    uStack_28 = uStack_28 & 0xffffffff;
    iVar2 = ImTextCharFromUtf8((uint *)((long)&uStack_28 + 4),text,text_end);
    if (iVar2 == 0) {
      return;
    }
    uVar3 = (uStack_28._4_4_ & 0xffff) >> 5;
    if (*(int *)this <= (int)uVar3) break;
    text = text + iVar2;
    puVar1 = (uint *)(*(long *)(this + 8) + (ulong)uVar3 * 4);
    *puVar1 = *puVar1 | 1 << ((byte)(uStack_28 >> 0x20) & 0x1f);
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                ,0x66a,"T &ImVector<unsigned int>::operator[](int) [T = unsigned int]");
}

Assistant:

void ImFontGlyphRangesBuilder::AddText(const char* text, const char* text_end)
{
    while (text_end ? (text < text_end) : *text)
    {
        unsigned int c = 0;
        int c_len = ImTextCharFromUtf8(&c, text, text_end);
        text += c_len;
        if (c_len == 0)
            break;
        AddChar((ImWchar)c);
    }
}